

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

string * __thiscall
t_haxe_generator::argument_list_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_struct *tstruct)

{
  bool bVar1;
  pointer pptVar2;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  bVar1 = true;
  for (pptVar2 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar2 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
    if (!bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::operator+(&local_70,&(*pptVar2)->name_," : ");
    type_name_abi_cxx11_(&local_90,this,(*pptVar2)->type_,false,false);
    std::operator+(&local_50,&local_70,&local_90);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    bVar1 = false;
  }
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::argument_list(t_struct* tstruct) {
  string result = "";

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      result += ", ";
    }
    result += (*f_iter)->get_name() + " : " + type_name((*f_iter)->get_type());
  }
  return result;
}